

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O0

int ovf::detail::parse::segment_data<float>
              (ovf_file *file,int index,ovf_segment *segment,float *data)

{
  reference in_string;
  int *in_R8;
  parse_error err;
  exception ex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_91;
  undefined4 local_90;
  bool success;
  int retcode;
  undefined1 local_80 [8];
  memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in;
  float *data_local;
  ovf_segment *segment_local;
  int index_local;
  ovf_file *file_local;
  
  in.
  super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_source.field_2._8_8_ = data;
  in_string = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&file->_state->file_contents,(long)index);
  tao::pegtl::
  memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>::
  memory_input<char_const(&)[1]>
            ((memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>
              *)local_80,in_string,(char (*) [1])0x1d6b55);
  local_90 = 0xfffffffe;
  local_91 = 0;
  if (file->version == 2) {
    file->_state->max_data_index = segment->N * segment->valuedim;
    local_91 = tao::pegtl::
               parse<ovf::detail::parse::v2::segment_data,_ovf::detail::parse::v2::ovf_segment_data_action,_tao::pegtl::normal,_(tao::pegtl::apply_mode)1,_(tao::pegtl::rewind_mode)1,_tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_ovf_file_&,_const_ovf_segment_&,_float_*&>
                         ((memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_80,file,segment,
                          (float **)
                          ((long)&in.
                                  super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  .m_source.field_2 + 8));
    file->_state->current_line = 0;
    file->_state->current_column = 0;
    if ((bool)local_91) {
      file_local._4_4_ = -1;
    }
    else {
      std::__cxx11::string::operator=
                ((string *)&file->_state->message_latest,
                 "libovf segment_data: no success in parsing");
      file_local._4_4_ = -3;
    }
  }
  else if (file->version == 1) {
    fmt::v5::format<char[71],char_const*,int>
              (&local_b8,
               (v5 *)"libovf segment_data: OVF version \'{}\' in file \'{}\' is not supported...",
               (char (*) [71])file,(char **)&file->version,in_R8);
    std::__cxx11::string::operator=((string *)&file->_state->message_latest,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    file_local._4_4_ = -3;
  }
  else {
    fmt::v5::format<char[71],char_const*,int>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ex,
               (v5 *)"libovf segment_data: OVF version \'{}\' in file \'{}\' is not supported...",
               (char (*) [71])file,(char **)&file->version,in_R8);
    std::__cxx11::string::operator=((string *)&file->_state->message_latest,(string *)&ex);
    std::__cxx11::string::~string((string *)&ex);
    file_local._4_4_ = -3;
  }
  tao::pegtl::
  memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~memory_input((memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_80);
  return file_local._4_4_;
}

Assistant:

int segment_data(ovf_file & file, int index, const ovf_segment & segment, scalar * data)
    try
    {
        pegtl::memory_input<> in( file._state->file_contents[index], "" );
        int retcode = OVF_ERROR;
        bool success = false;

        if( file.version == 2 )
        {
            file._state->max_data_index = segment.N*segment.valuedim;
            success = pegtl::parse< v2::segment_data, v2::ovf_segment_data_action >( in, file, segment, data );
            file._state->current_line = 0;
            file._state->current_column = 0;
        }
        else if( file.version == 1 )
        {
            // TODO...
            file._state->message_latest = fmt::format(
                "libovf segment_data: OVF version \'{}\' in file \'{}\' is not supported...",
                file.file_name, file.version);
            return OVF_INVALID;
        }
        else
        {
            file._state->message_latest = fmt::format(
                "libovf segment_data: OVF version \'{}\' in file \'{}\' is not supported...",
                file.file_name, file.version);
            return OVF_INVALID;
        }

        if( success )
        {
            return OVF_OK;
        }
        else
        {
            file._state->message_latest = "libovf segment_data: no success in parsing";
            return OVF_INVALID;
        }
    }
    catch( pegtl::parse_error err )
    {
        file._state->message_latest = fmt::format(
            "libovf segment_data: pegtl parse error \'{}\'", + err.what());
        return OVF_ERROR;
    }
    catch( std::exception ex )
    {
        file._state->message_latest = fmt::format(
            "libovf segment_data: std::exception \'{}\'", + ex.what());
        return OVF_ERROR;
    }
    catch( ... )
    {
        // Make sure it really never crashes
        try
        {
            file._state->message_latest = "libovf segment_data: unknown exception";
            return OVF_ERROR;
        }
        catch( ... )
        {
            std::cerr << "libovf segment_data: unrecoverable error" << '\n';
            return OVF_ERROR;
        }
    }